

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall
CConnman::AddConnection
          (CConnman *this,string *address,ConnectionType conn_type,bool use_v2transport)

{
  pointer ppCVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int unaff_R15D;
  long in_FS_OFFSET;
  CSemaphoreGrant grant;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  CSemaphoreGrant local_80;
  CAddress local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  cVar3 = '\0';
  bVar2 = 0;
  switch(conn_type) {
  case INBOUND:
  case MANUAL:
switchD_0017aa08_caseD_0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)cVar3;
    }
    __stack_chk_fail();
  case OUTBOUND_FULL_RELAY:
    unaff_R15D = this->m_max_outbound_full_relay;
    break;
  default:
    goto switchD_0017aa08_caseD_3;
  case BLOCK_RELAY:
    unaff_R15D = this->m_max_outbound_block_relay;
  }
  bVar2 = 1;
switchD_0017aa08_caseD_3:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_70,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x738,false);
  for (ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    iVar4 = iVar4 + (uint)((*ppCVar1)->m_conn_type == conn_type);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_70);
  if ((bool)(bVar2 & unaff_R15D <= iVar4)) {
    cVar3 = '\0';
  }
  else {
    local_80.sem = (this->semOutbound)._M_t.
                   super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                   super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                   super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
    local_80.fHaveGrant = false;
    CSemaphoreGrant::TryAcquire(&local_80);
    cVar3 = local_80.fHaveGrant;
    if (local_80.fHaveGrant == true) {
      CAddress::CAddress(&local_70);
      OpenNetworkConnection
                (this,&local_70,false,&local_80,(address->_M_dataplus)._M_p,conn_type,
                 use_v2transport);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70);
    }
    CSemaphoreGrant::Release(&local_80);
  }
  goto switchD_0017aa08_caseD_0;
}

Assistant:

bool CConnman::AddConnection(const std::string& address, ConnectionType conn_type, bool use_v2transport = false)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    std::optional<int> max_connections;
    switch (conn_type) {
    case ConnectionType::INBOUND:
    case ConnectionType::MANUAL:
        return false;
    case ConnectionType::OUTBOUND_FULL_RELAY:
        max_connections = m_max_outbound_full_relay;
        break;
    case ConnectionType::BLOCK_RELAY:
        max_connections = m_max_outbound_block_relay;
        break;
    // no limit for ADDR_FETCH because -seednode has no limit either
    case ConnectionType::ADDR_FETCH:
        break;
    // no limit for FEELER connections since they're short-lived
    case ConnectionType::FEELER:
        break;
    } // no default case, so the compiler can warn about missing cases

    // Count existing connections
    int existing_connections = WITH_LOCK(m_nodes_mutex,
                                         return std::count_if(m_nodes.begin(), m_nodes.end(), [conn_type](CNode* node) { return node->m_conn_type == conn_type; }););

    // Max connections of specified type already exist
    if (max_connections != std::nullopt && existing_connections >= max_connections) return false;

    // Max total outbound connections already exist
    CSemaphoreGrant grant(*semOutbound, true);
    if (!grant) return false;

    OpenNetworkConnection(CAddress(), false, std::move(grant), address.c_str(), conn_type, /*use_v2transport=*/use_v2transport);
    return true;
}